

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O0

bool __thiscall
Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>::
_solve<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *this,
          MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *B,
          MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *X_base)

{
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar1;
  Index IVar2;
  Index nbCols;
  long lVar3;
  PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *pPVar4;
  ColXpr local_158;
  ColXpr local_130;
  PermutationType *local_108;
  permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_true>
  local_100;
  int local_cc;
  undefined1 auStack_c8 [4];
  Index j_1;
  MappedSuperNodalMatrix<double,_int> *local_b8;
  ColXpr local_b0;
  ColXpr local_88;
  permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_false>
  local_60;
  int local_2c;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDStack_28;
  Index j;
  Matrix<double,__1,__1,_0,__1,__1> *X;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *X_base_local;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *B_local;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *this_local;
  
  X = (Matrix<double,__1,__1,_0,__1,__1> *)X_base;
  X_base_local = B;
  B_local = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
  pDVar1 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                     ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)X_base);
  pDStack_28 = pDVar1;
  if (((byte)this[5] & 1) == 0) {
    __assert_fail("m_factorizationIsOk && \"The matrix should be factorized first\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                  ,0xe1,
                  "bool Eigen::SparseLU<Eigen::SparseMatrix<double>>::_solve(const MatrixBase<Rhs> &, MatrixBase<Dest> &) const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>, Rhs = Eigen::Matrix<double, -1, -1>, Dest = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  IVar2 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)X_base_local);
  nbCols = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                     ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)X_base_local);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pDVar1,IVar2,nbCols);
  for (local_2c = 0; lVar3 = (long)local_2c,
      IVar2 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)X_base_local),
      lVar3 < IVar2; local_2c = local_2c + 1) {
    pPVar4 = (PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)
             SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
             rowsPermutation((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                              *)this);
    pDVar1 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::const_cast_derived
                       ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)X_base_local);
    DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col(&local_88,pDVar1,(long)local_2c);
    Eigen::operator*(&local_60,pPVar4,
                     (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)&local_88);
    DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col(&local_b0,pDStack_28,(long)local_2c);
    MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)&local_b0,
               (ReturnByValue<Eigen::internal::permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_false>_>
                *)&local_60);
  }
  local_b8 = (MappedSuperNodalMatrix<double,_int> *)
             SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::matrixL
                       ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                         *)this);
  SparseLUMatrixLReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>>::
  solveInPlace<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((SparseLUMatrixLReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>> *)
             &local_b8,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pDStack_28);
  _auStack_c8 = SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::matrixU
                          ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                            *)this);
  SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
  ::solveInPlace<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
              *)auStack_c8,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)pDStack_28);
  for (local_cc = 0; lVar3 = (long)local_cc,
      IVar2 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)X_base_local),
      lVar3 < IVar2; local_cc = local_cc + 1) {
    pPVar4 = (PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *)
             SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
             colsPermutation((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>
                              *)this);
    local_108 = (PermutationType *)
                PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::inverse(pPVar4);
    DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col(&local_130,pDStack_28,(long)local_cc);
    Transpose<Eigen::PermutationBase<Eigen::PermutationMatrix<-1,-1,int>>>::operator*
              (&local_100,
               (Transpose<Eigen::PermutationBase<Eigen::PermutationMatrix<_1,_1,int>>> *)&local_108,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               &local_130);
    DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col(&local_158,pDStack_28,(long)local_cc);
    MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)&local_158
               ,(ReturnByValue<Eigen::internal::permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_true>_>
                 *)&local_100);
  }
  return true;
}

Assistant:

bool _solve(const MatrixBase<Rhs> &B, MatrixBase<Dest> &X_base) const
    {
      Dest& X(X_base.derived());
      eigen_assert(m_factorizationIsOk && "The matrix should be factorized first");
      EIGEN_STATIC_ASSERT((Dest::Flags&RowMajorBit)==0,
                        THIS_METHOD_IS_ONLY_FOR_COLUMN_MAJOR_MATRICES);
      
      // Permute the right hand side to form X = Pr*B
      // on return, X is overwritten by the computed solution
      X.resize(B.rows(),B.cols());

      // this ugly const_cast_derived() helps to detect aliasing when applying the permutations
      for(Index j = 0; j < B.cols(); ++j)
        X.col(j) = rowsPermutation() * B.const_cast_derived().col(j);
      
      //Forward substitution with L
      this->matrixL().solveInPlace(X);
      this->matrixU().solveInPlace(X);
      
      // Permute back the solution 
      for (Index j = 0; j < B.cols(); ++j)
        X.col(j) = colsPermutation().inverse() * X.col(j);
      
      return true; 
    }